

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O1

Element __thiscall ftxui::TabContainer::Render(TabContainer *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  long *in_RSI;
  Element EVar2;
  Component active_child;
  string local_40;
  long *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  
  (**(code **)(*in_RSI + 0x20))(&local_20);
  if (local_20 == (long *)0x0) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Empty container","");
    EVar2 = text((ftxui *)this,&local_40);
    _Var1 = EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      _Var1._M_pi = extraout_RDX_00;
    }
  }
  else {
    (**(code **)(*local_20 + 0x10))(this);
    _Var1._M_pi = extraout_RDX;
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    _Var1._M_pi = extraout_RDX_01;
  }
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() override {
    Component active_child = ActiveChild();
    if (active_child)
      return active_child->Render();
    return text("Empty container");
  }